

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O2

void set_cartridge(cartridge_t cart)

{
  if (cart.cart_type == rom_only) {
    if (cart.rom_size != _32K) {
      err(F,"ROM size too big for this type of cartridge");
    }
    if (cart.ram_size != no_ram) {
      err(F,"RAM size too big for this type of cartridge");
    }
  }
  else {
    err(F,"unknwon cartridge type");
  }
  num_rom_banks = (0x8000 << ((byte)cart.rom_size & 0x1f)) >> 0xe;
  return;
}

Assistant:

void set_cartridge(cartridge_t cart)
{
    int romsize;

    if (cart.gb_type == dmg)
        num_wram_banks = 2;

    if (cart.cart_type == rom_only)
    {
        if (cart.rom_size != _32K)
            err(F, "ROM size too big for this type of cartridge");
        if (cart.ram_size != no_ram)
            err(F, "RAM size too big for this type of cartridge");
    }
    else
        err(F, "unknwon cartridge type");

    romsize = 0x8000 << (int)cart.rom_size;
    num_rom_banks = romsize / ROM_BANK_SIZE;

    switch(cart.ram_size)
    {
        /* In order to make .org work we need a RAM slot even if there
         is no ram */
        case no_ram:
        default: num_ram_banks = 1;
    }
}